

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# icosahedralBuilderCmd.cpp
# Opt level: O0

int cmdline_parser2(int argc,char **argv,gengetopt_args_info *args_info,int override,int initialize,
                   int check_required)

{
  int iVar1;
  cmdline_parser_params params;
  int result;
  char *in_stack_000001d8;
  cmdline_parser_params *in_stack_000001e0;
  gengetopt_args_info *in_stack_000001e8;
  char **in_stack_000001f0;
  int in_stack_000001f8;
  
  iVar1 = cmdline_parser_internal
                    (in_stack_000001f8,in_stack_000001f0,in_stack_000001e8,in_stack_000001e0,
                     in_stack_000001d8);
  return iVar1;
}

Assistant:

int
cmdline_parser2 (int argc, char **argv, struct gengetopt_args_info *args_info, int override, int initialize, int check_required)
{
  int result;
  struct cmdline_parser_params params;
  
  params.override = override;
  params.initialize = initialize;
  params.check_required = check_required;
  params.check_ambiguity = 0;
  params.print_errors = 1;

  result = cmdline_parser_internal (argc, argv, args_info, &params, 0);

  return result;
}